

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O3

partSizeData *
initAndReadDeepTiled
          (partSizeData *__return_storage_ptr__,vector<int,_std::allocator<int>_> *sampleCount,
          vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
          *sampleData,
          vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
          *pixelPtrs,DeepFrameBuffer *buf,DeepTiledInputPart *in,
          vector<int,_std::allocator<int>_> *inputSampleCount,Header *outHeader,
          vector<double,_std::allocator<double>_> *countPerf,
          vector<double,_std::allocator<double>_> *samplePerf)

{
  iterator iVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  Header *h;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_node_base *p_Var8;
  size_type sVar9;
  runtime_error *this;
  size_type __new_size;
  int iVar10;
  size_type __new_size_00;
  long lVar11;
  long lVar12;
  long local_b0;
  double local_68 [7];
  
  Imf_3_4::DeepTiledInputPart::header();
  lVar5 = Imf_3_4::Header::tileDescription();
  if (*(int *)(lVar5 + 8) == 2) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"exrmetrics does not support ripmapped deep tiled parts")
    ;
  }
  else {
    if (*(int *)(lVar5 + 8) != 1) {
      Imf_3_4::DeepTiledInputPart::header();
      piVar6 = (int *)Imf_3_4::Header::dataWindow();
      iVar10 = *piVar6;
      iVar4 = piVar6[1];
      lVar12 = (long)((piVar6[2] - iVar10) + 1);
      __new_size_00 = ((piVar6[3] - iVar4) + 1) * lVar12;
      h = (Header *)Imf_3_4::DeepTiledInputPart::header();
      iVar3 = channelCount(h);
      lVar5 = iVar4 * lVar12 + (long)iVar10;
      __new_size = (size_type)iVar3;
      std::
      vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
      ::resize(pixelPtrs,__new_size);
      std::vector<int,_std::allocator<int>_>::resize(sampleCount,__new_size_00);
      Imf_3_4::Slice::Slice
                ((Slice *)local_68,UINT,
                 (char *)((sampleCount->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start + -lVar5),4,lVar12 * 4,1,1,0.0,false,
                 false);
      Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)buf);
      Imf_3_4::Header::channels();
      p_Var7 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
      Imf_3_4::Header::channels();
      p_Var8 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
      if (p_Var7 == p_Var8) {
        local_b0 = 0;
      }
      else {
        lVar11 = 0;
        iVar10 = 0;
        do {
          std::vector<char_*,_std::allocator<char_*>_>::resize
                    ((vector<char_*,_std::allocator<char_*>_> *)
                     ((long)&(((pixelPtrs->
                               super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
                             super__Vector_impl_data + lVar11),__new_size_00);
          iVar4 = Imf_3_4::pixelTypeSize(p_Var7[9]._M_color);
          Imf_3_4::DeepSlice::DeepSlice
                    ((DeepSlice *)local_68,p_Var7[9]._M_color,
                     (char *)(*(long *)((long)&(((pixelPtrs->
                                                 super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               super__Vector_base<char_*,_std::allocator<char_*>_>).
                                               _M_impl.super__Vector_impl_data + lVar11) +
                             lVar5 * -8),8,lVar12 << 3,(long)iVar4,1,1,0.0,false,false);
          Imf_3_4::DeepFrameBuffer::insert((char *)buf,(DeepSlice *)(p_Var7 + 1));
          iVar10 = iVar10 + iVar4;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
          Imf_3_4::Header::channels();
          p_Var8 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
          lVar11 = lVar11 + 0x18;
        } while (p_Var7 != p_Var8);
        local_b0 = (long)iVar10;
      }
      iVar10 = (int)in;
      pvVar2 = inputSampleCount;
      if (inputSampleCount == (vector<int,_std::allocator<int>_> *)0x0) {
        Imf_3_4::DeepTiledInputPart::setFrameBuffer((DeepFrameBuffer *)in);
        lVar5 = std::chrono::_V2::steady_clock::now();
        iVar4 = Imf_3_4::DeepTiledInputPart::numXTiles(iVar10);
        iVar3 = Imf_3_4::DeepTiledInputPart::numYTiles(iVar10);
        Imf_3_4::DeepTiledInputPart::readPixelSampleCounts(iVar10,0,iVar4 + -1,0,iVar3 + -1,0);
        lVar12 = std::chrono::_V2::steady_clock::now();
        local_68[0] = (double)(lVar12 - lVar5) / 1000000000.0;
        iVar1._M_current =
             (countPerf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        pvVar2 = sampleCount;
        if (iVar1._M_current ==
            (countPerf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (countPerf,iVar1,local_68);
        }
        else {
          *iVar1._M_current = local_68[0];
          (countPerf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
      }
      lVar5 = 0;
      for (piVar6 = (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          piVar6 != (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish; piVar6 = piVar6 + 1) {
        lVar5 = lVar5 + *piVar6;
      }
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::resize(sampleData,__new_size);
      Imf_3_4::DeepTiledInputPart::header();
      Imf_3_4::Header::channels();
      p_Var7 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
      Imf_3_4::DeepTiledInputPart::header();
      Imf_3_4::Header::channels();
      p_Var8 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
      if (p_Var7 != p_Var8) {
        lVar12 = 0;
        do {
          iVar4 = Imf_3_4::pixelTypeSize(p_Var7[9]._M_color);
          std::vector<char,_std::allocator<char>_>::resize
                    ((sampleData->
                     super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + lVar12,iVar4 * lVar5);
          if (__new_size_00 != 0) {
            sVar9 = 0;
            iVar3 = 0;
            do {
              *(long *)(*(long *)&(pixelPtrs->
                                  super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[lVar12].
                                  super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                  super__Vector_impl_data + sVar9 * 8) =
                   (long)(iVar3 * iVar4) +
                   *(long *)&(sampleData->
                             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[lVar12].
                             super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data;
              iVar3 = iVar3 + (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[sVar9];
              sVar9 = sVar9 + 1;
            } while (__new_size_00 != sVar9);
          }
          lVar12 = lVar12 + 1;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
          Imf_3_4::DeepTiledInputPart::header();
          Imf_3_4::Header::channels();
          p_Var8 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
        } while (p_Var7 != p_Var8);
      }
      if (inputSampleCount == (vector<int,_std::allocator<int>_> *)0x0) {
        lVar12 = std::chrono::_V2::steady_clock::now();
        iVar4 = Imf_3_4::DeepTiledInputPart::numXTiles(iVar10);
        iVar3 = Imf_3_4::DeepTiledInputPart::numYTiles(iVar10);
        Imf_3_4::DeepTiledInputPart::readTiles(iVar10,0,iVar4 + -1,0,iVar3 + -1,0);
        lVar11 = std::chrono::_V2::steady_clock::now();
        local_68[0] = (double)(lVar11 - lVar12) / 1000000000.0;
        iVar1._M_current =
             (samplePerf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (samplePerf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (samplePerf,iVar1,local_68);
        }
        else {
          *iVar1._M_current = local_68[0];
          (samplePerf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
      }
      __return_storage_ptr__->tileCount = 0;
      __return_storage_ptr__->compression = NUM_COMPRESSION_METHODS;
      (__return_storage_ptr__->partType)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->partType).field_2;
      (__return_storage_ptr__->partType)._M_string_length = 0;
      (__return_storage_ptr__->partType).field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->rawSize = lVar5 * local_b0 + __new_size_00 * 4;
      __return_storage_ptr__->pixelCount = __new_size_00;
      __return_storage_ptr__->isDeep = true;
      __return_storage_ptr__->isTiled = true;
      __return_storage_ptr__->channelCount = __new_size;
      return __return_storage_ptr__;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"exrmetrics does not support mipmapped deep tiled parts")
    ;
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

partSizeData
initAndReadDeepTiled (
    vector<int>&           sampleCount,
    vector<vector<char>>&  sampleData,
    vector<vector<char*>>& pixelPtrs,
    DeepFrameBuffer&       buf,
    DeepTiledInputPart&    in,
    const vector<int>*     inputSampleCount,
    const Header&          outHeader,
    vector<double>&        countPerf,
    vector<double>&        samplePerf)
{

    TileDescription tiling = in.header ().tileDescription ();

    if (tiling.mode == MIPMAP_LEVELS)
    {
        throw runtime_error (
            "exrmetrics does not support mipmapped deep tiled parts");
    }

    if (tiling.mode == RIPMAP_LEVELS)
    {
        throw runtime_error (
            "exrmetrics does not support ripmapped deep tiled parts");
    }

    Box2i    dw        = in.header ().dataWindow ();
    uint64_t width     = dw.max.x + 1 - dw.min.x;
    uint64_t height    = dw.max.y + 1 - dw.min.y;
    uint64_t numPixels = width * height;
    int      numChans  = channelCount (in.header ());

    uint64_t offsetToOrigin = width * static_cast<uint64_t> (dw.min.y) +
                              static_cast<uint64_t> (dw.min.x);

    pixelPtrs.resize (numChans);
    sampleCount.resize (numPixels);

    buf.insertSampleCountSlice (Slice (
        UINT,
        (char*) (sampleCount.data () - offsetToOrigin),
        sizeof (int),
        sizeof (int) * width));
    int channelNumber  = 0;
    int bytesPerSample = 0;

    for (ChannelList::ConstIterator i = outHeader.channels ().begin ();
         i != outHeader.channels ().end ();
         ++i)
    {
        pixelPtrs[channelNumber].resize (numPixels);
        int samplesize = pixelTypeSize (i.channel ().type);
        buf.insert (
            i.name (),
            DeepSlice (
                i.channel ().type,
                (char*) (pixelPtrs[channelNumber].data () - offsetToOrigin),
                sizeof (char*),
                sizeof (char*) * width,
                samplesize));
        ++channelNumber;
        bytesPerSample += samplesize;
    }

    const vector<int>& samples = inputSampleCount ? *inputSampleCount
                                                  : sampleCount;

    if (!inputSampleCount)
    {
        in.setFrameBuffer (buf);

        steady_clock::time_point startCountRead = steady_clock::now ();

        in.readPixelSampleCounts (
            0, in.numXTiles (0) - 1, 0, in.numYTiles (0) - 1, 0, 0);
        steady_clock::time_point endCountRead = steady_clock::now ();

        countPerf.push_back (timing (startCountRead, endCountRead));
    }
    size_t totalSamples = 0;

    for (int i: samples)
    {
        totalSamples += i;
    }

    sampleData.resize (numChans);
    channelNumber = 0;

    for (ChannelList::ConstIterator i = in.header ().channels ().begin ();
         i != in.header ().channels ().end ();
         ++i)
    {
        int samplesize = pixelTypeSize (i.channel ().type);
        sampleData[channelNumber].resize (samplesize * totalSamples);
        int offset = 0;
        for (uint64_t p = 0; p < numPixels; ++p)
        {
            pixelPtrs[channelNumber][p] =
                sampleData[channelNumber].data () + offset * samplesize;
            offset += samples[p];
        }

        ++channelNumber;
    }

    if (!inputSampleCount)
    {
        steady_clock::time_point startSampleRead = steady_clock::now ();
        in.readTiles (0, in.numXTiles (0) - 1, 0, in.numYTiles (0) - 1, 0, 0);
        steady_clock::time_point endSampleRead = steady_clock::now ();

        samplePerf.push_back (timing (startSampleRead, endSampleRead));
    }

    partSizeData data;
    data.rawSize    = totalSamples * bytesPerSample + numPixels * sizeof (int);
    data.pixelCount = numPixels;
    data.isDeep     = true;
    data.isTiled    = true;
    data.channelCount = numChans;
    return data;
}